

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,Benchmark *other)

{
  void *pvVar1;
  BenchmarkImp *in_RSI;
  undefined8 *in_RDI;
  BenchmarkImp *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__Benchmark_001cb7e8;
  pvVar1 = operator_new(0x80);
  BenchmarkImp::BenchmarkImp(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI[1] = pvVar1;
  return;
}

Assistant:

Benchmark::Benchmark(Benchmark const& other)
  : imp_(new BenchmarkImp(*other.imp_))
{
}